

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O3

DTLSSentRecord * __thiscall
bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>::operator[]
          (MRUQueue<bssl::DTLSSentRecord,_32UL> *this,size_t i)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(this->storage_).size_;
  if ((i < uVar1) && (uVar2 = (ulong)((int)i + *(int *)&this->start_ & 0x1f), uVar2 < uVar1)) {
    return (DTLSSentRecord *)((this->storage_).storage_ + uVar2 * 0x18);
  }
  abort();
}

Assistant:

T &operator[](size_t i) {
    BSSL_CHECK(i < size());
    return storage_[(start_ + i) % N];
  }